

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::AddGlyph(ImFont *this,ImWchar codepoint,float x0,float y0,float x1,float y1,float u0,
                float v0,float u1,float v1,float advance_x)

{
  ImFontConfig *pIVar1;
  ImFontGlyph *pIVar2;
  undefined6 in_register_00000032;
  float fVar3;
  
  ImVector<ImFontGlyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
  pIVar2 = ImVector<ImFontGlyph>::back(&this->Glyphs);
  *(uint *)pIVar2 =
       (uint)(x0 != x1 && y0 != y1) * -0x80000000 | (uint)CONCAT62(in_register_00000032,codepoint);
  pIVar2->X0 = x0;
  pIVar2->Y0 = y0;
  pIVar2->X1 = x1;
  pIVar2->Y1 = y1;
  pIVar2->U0 = u0;
  pIVar2->V0 = v0;
  pIVar2->U1 = u1;
  pIVar2->V1 = v1;
  pIVar1 = this->ConfigData;
  fVar3 = (pIVar1->GlyphExtraSpacing).x + advance_x;
  pIVar2->AdvanceX = fVar3;
  if (pIVar1->PixelSnapH == true) {
    pIVar2->AdvanceX = (float)(int)(fVar3 + 0.5);
  }
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       this->MetricsTotalSurface +
       (int)((float)this->ContainerAtlas->TexHeight * (v1 - v0) + 1.99) *
       (int)((float)this->ContainerAtlas->TexWidth * (u1 - u0) + 1.99);
  return;
}

Assistant:

void ImFont::AddGlyph(ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x + ConfigData->GlyphExtraSpacing.x;  // Bake spacing into AdvanceX

    if (ConfigData->PixelSnapH)
        glyph.AdvanceX = IM_ROUND(glyph.AdvanceX);

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + 1.99f) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + 1.99f);
}